

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  char *pcVar1;
  char *pcVar2;
  char *format;
  string sStack_38;
  
  if (actual->mut == expected->mut) {
    if (*(int *)&(actual->super_ExternType).field_0xc ==
        *(int *)&(expected->super_ExternType).field_0xc) {
      return (Result)Ok;
    }
    pcVar1 = GetName((ValueType)0x0);
    pcVar2 = GetName((ValueType)0x0);
    format = "type mismatch in imported global, expected %s but got %s.";
  }
  else {
    pcVar1 = GetName::kNames[(int)actual->mut];
    pcVar2 = GetName::kNames[(int)expected->mut];
    format = "mutability mismatch in imported global, expected %s but got %s.";
  }
  StringPrintf_abi_cxx11_(&sStack_38,format,pcVar1,pcVar2);
  std::__cxx11::string::operator=((string *)out_msg,(string *)&sStack_38);
  std::__cxx11::string::_M_dispose();
  return (Result)Error;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type), GetName(actual.type));
    return Result::Error;
  }

  return Result::Ok;
}